

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

void __thiscall QFileSystemModel::sort(QFileSystemModel *this,int column,SortOrder order)

{
  QFileSystemModelPrivate *this_00;
  QFileSystemModelPrivate *this_01;
  iterator iVar1;
  iterator iVar2;
  QFileSystemNode *pQVar3;
  QModelIndex *oldNode;
  pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> *ppVar4;
  pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> *ppVar5;
  long in_FS_OFFSET;
  undefined1 local_b8 [16];
  qsizetype local_a8;
  undefined1 local_98 [16];
  qsizetype local_88;
  QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_> local_78;
  QArrayDataPointer<QPersistentModelIndex> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileSystemModelPrivate **)&this->field_0x8;
  if (((this_00->sortOrder != order) || (this_00->sortColumn != column)) ||
     (this_00->forceSort == true)) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (QPersistentModelIndex *)0x0;
    local_58.size = 0;
    QAbstractItemModel::layoutAboutToBeChanged((QList_conflict *)this,(LayoutChangeHint)&local_58);
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_58);
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemModel::persistentIndexList();
    local_78.d.size = 0;
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = (pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> *)0x0;
    QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_>::reserve
              (&local_78,local_58.size);
    iVar1 = QList<QModelIndex>::begin((QList<QModelIndex> *)&local_58);
    iVar2 = QList<QModelIndex>::end((QList<QModelIndex> *)&local_58);
    if (iVar1.i != iVar2.i) {
      do {
        local_98._0_8_ = &this_00->root;
        if (((iVar1.i)->m).ptr != (QAbstractItemModel *)0x0) {
          local_98._0_8_ = (iVar1.i)->i;
        }
        if (((iVar1.i)->r | (iVar1.i)->c) < 0) {
          local_98._0_8_ = &this_00->root;
        }
        local_b8._0_4_ = (iVar1.i)->c;
        QtPrivate::QPodArrayOps<std::pair<QFileSystemModelPrivate::QFileSystemNode*,int>>::
        emplace<QFileSystemModelPrivate::QFileSystemNode*,int>
                  ((QPodArrayOps<std::pair<QFileSystemModelPrivate::QFileSystemNode*,int>> *)
                   &local_78,local_78.d.size,(QFileSystemNode **)local_98,(int *)local_b8);
        QList<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_>::end(&local_78);
        iVar1.i = iVar1.i + 1;
      } while (iVar1.i != iVar2.i);
    }
    if (((this_00->sortColumn != column) || (this_00->sortOrder == order)) ||
       (this_00->forceSort == true)) {
      QDir::path();
      this_01 = *(QFileSystemModelPrivate **)&this->field_0x8;
      pQVar3 = QFileSystemModelPrivate::node(this_01,(QString *)local_b8,false);
      QFileSystemModelPrivate::index
                ((QFileSystemModelPrivate *)local_98,(char *)this_01,(int)pQVar3);
      QFileSystemModelPrivate::sortChildren(this_00,column,(QModelIndex *)local_98);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      this_00->sortColumn = column;
      this_00->forceSort = false;
    }
    this_00->sortOrder = order;
    local_98._0_8_ = (QFileSystemNode *)0x0;
    local_98._8_8_ = (QModelIndex *)0x0;
    local_88 = 0;
    QList<QModelIndex>::reserve((QList<QModelIndex> *)local_98,local_78.d.size);
    if (local_78.d.size != 0) {
      ppVar5 = local_78.d.ptr + local_78.d.size;
      ppVar4 = local_78.d.ptr;
      do {
        QFileSystemModelPrivate::index
                  ((QFileSystemModelPrivate *)local_b8,(char *)this_00,(int)ppVar4->first);
        QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex>
                  ((QMovableArrayOps<QModelIndex> *)local_98,local_88,(QModelIndex *)local_b8);
        QList<QModelIndex>::end((QList<QModelIndex> *)local_98);
        ppVar4 = ppVar4 + 1;
      } while (ppVar4 != ppVar5);
    }
    QAbstractItemModel::changePersistentIndexList
              ((QList_conflict *)this,(QList_conflict *)&local_58);
    local_b8._0_8_ = (QArrayData *)0x0;
    local_b8._8_8_ = (QPersistentModelIndex *)0x0;
    local_a8 = 0;
    QAbstractItemModel::layoutChanged
              ((QList_conflict *)this,
               (LayoutChangeHint)(QArrayDataPointer<QPersistentModelIndex> *)local_b8);
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
              ((QArrayDataPointer<QPersistentModelIndex> *)local_b8);
    if ((QFileSystemNode *)local_98._0_8_ != (QFileSystemNode *)0x0) {
      LOCK();
      ((__atomic_base<int> *)&(((QString *)local_98._0_8_)->d).d)->_M_i =
           ((__atomic_base<int> *)&(((QString *)local_98._0_8_)->d).d)->_M_i + -1;
      UNLOCK();
      if (((__atomic_base<int> *)&(((QString *)local_98._0_8_)->d).d)->_M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,0x18,0x10);
      }
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,0x10,0x10);
      }
    }
    if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,0x18,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModel::sort(int column, Qt::SortOrder order)
{
    Q_D(QFileSystemModel);
    if (d->sortOrder == order && d->sortColumn == column && !d->forceSort)
        return;

    emit layoutAboutToBeChanged();
    QModelIndexList oldList = persistentIndexList();
    QList<std::pair<QFileSystemModelPrivate::QFileSystemNode *, int>> oldNodes;
    oldNodes.reserve(oldList.size());
    for (const QModelIndex &oldNode : oldList)
        oldNodes.emplace_back(d->node(oldNode), oldNode.column());

    if (!(d->sortColumn == column && d->sortOrder != order && !d->forceSort)) {
        //we sort only from where we are, don't need to sort all the model
        d->sortChildren(column, index(rootPath()));
        d->sortColumn = column;
        d->forceSort = false;
    }
    d->sortOrder = order;

    QModelIndexList newList;
    newList.reserve(oldNodes.size());
    for (const auto &[node, col]: std::as_const(oldNodes))
        newList.append(d->index(node, col));

    changePersistentIndexList(oldList, newList);
    emit layoutChanged({}, VerticalSortHint);
}